

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_reserve.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  vector<Foo,_std::allocator<Foo>_> v;
  vector<Foo,_std::allocator<Foo>_> local_78;
  string local_58;
  Foo local_38;
  
  local_78.super__Vector_base<Foo,_std::allocator<Foo>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<Foo,_std::allocator<Foo>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<Foo,_std::allocator<Foo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"hello","");
  Foo::Foo(&local_38,1,&local_58);
  std::vector<Foo,_std::allocator<Foo>_>::emplace_back<Foo>(&local_78,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.s._M_dataplus._M_p != &local_38.s.field_2) {
    operator_delete(local_38.s._M_dataplus._M_p,local_38.s.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_38.i = 3;
  std::vector<Foo,std::allocator<Foo>>::emplace_back<int,char_const(&)[6]>
            ((vector<Foo,std::allocator<Foo>> *)&local_78,&local_38.i,(char (*) [6])"world");
  std::vector<Foo,_std::allocator<Foo>_>::~vector(&local_78);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    vector<Foo> v;
    // v.reserve(2);
    v.push_back(Foo(1, "hello"));

    v.emplace_back(3, "world");

    return 0;
}